

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_memory.c
# Opt level: O1

int archive_read_open_memory2(archive *a,void *buff,size_t size,size_t read_size)

{
  int iVar1;
  undefined8 *client_data;
  
  client_data = (undefined8 *)malloc(0x20);
  if (client_data != (undefined8 *)0x0) {
    *client_data = 0;
    client_data[1] = 0;
    client_data[2] = 0;
    client_data[3] = 0;
    client_data[1] = buff;
    *client_data = buff;
    client_data[2] = size + (long)buff;
    client_data[3] = read_size;
    archive_read_set_open_callback(a,memory_read_open);
    archive_read_set_read_callback(a,memory_read);
    archive_read_set_seek_callback(a,memory_read_seek);
    archive_read_set_skip_callback(a,memory_read_skip);
    archive_read_set_close_callback(a,memory_read_close);
    archive_read_set_callback_data(a,client_data);
    iVar1 = archive_read_open1(a);
    return iVar1;
  }
  archive_set_error(a,0xc,"No memory");
  return -0x1e;
}

Assistant:

int
archive_read_open_memory2(struct archive *a, void *buff,
    size_t size, size_t read_size)
{
	struct read_memory_data *mine;

	mine = (struct read_memory_data *)malloc(sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	memset(mine, 0, sizeof(*mine));
	mine->start = mine->p = (unsigned char *)buff;
	mine->end = mine->start + size;
	mine->read_size = read_size;
	archive_read_set_open_callback(a, memory_read_open);
	archive_read_set_read_callback(a, memory_read);
	archive_read_set_seek_callback(a, memory_read_seek);
	archive_read_set_skip_callback(a, memory_read_skip);
	archive_read_set_close_callback(a, memory_read_close);
	archive_read_set_callback_data(a, mine);
	return (archive_read_open1(a));
}